

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O1

int __thiscall Js::TypePath::AddInternal<false>(TypePath *this,PropertyRecord *propId)

{
  byte bVar1;
  RecyclerWeakReference<Js::DynamicObject> *pRVar2;
  Data *pDVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  uint uVar7;
  PropertyRecord *pPVar8;
  Type pcVar9;
  uint index;
  
  iVar6 = Data::Add<false>((this->data).ptr,propId,(Type *)(this + 1));
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015cd718,FixMethodPropsPhase);
  if ((bVar4) && (DAT_015d346a == '\x01')) {
    pRVar2 = (this->singletonInstance).ptr;
    if (pRVar2 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
      pcVar9 = (Type)0x0;
    }
    else {
      pcVar9 = (pRVar2->super_RecyclerWeakReferenceBase).strongRef;
    }
    Output::Print(L"FixedFields: TypePath::AddInternal: singleton = 0x%p(0x%p)\n",pRVar2,pcVar9);
    Output::Print(L"   fixed fields:");
    bVar1 = ((this->data).ptr)->pathLength;
    uVar7 = (uint)bVar1;
    if (bVar1 != 0) {
      index = 0;
      do {
        if (index < uVar7) {
          pPVar8 = GetPropertyIdUnchecked(this,index);
        }
        else {
          pPVar8 = (PropertyRecord *)0x0;
        }
        pDVar3 = (this->data).ptr;
        bVar1 = pDVar3->maxInitializedLength;
        bVar4 = GetIsFixedFieldAt(this,(PropertyIndex)index,(uint)pDVar3->pathLength);
        bVar5 = GetIsUsedFixedFieldAt
                          (this,(PropertyIndex)index,(uint)((this->data).ptr)->pathLength);
        Output::Print(L" %s %d%d%d,",pPVar8 + 1,(ulong)(index < bVar1),(ulong)bVar4,(ulong)bVar5);
        index = index + 1;
        uVar7 = (uint)((this->data).ptr)->pathLength;
      } while (index < uVar7);
    }
    Output::Print(L"\n");
  }
  return iVar6;
}

Assistant:

int AddInternal(const PropertyRecord * propId)
    {
        int propertyIndex = this->GetData()->Add<addNewId>(propId, assignments);

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
        if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
        {
            Output::Print(_u("FixedFields: TypePath::AddInternal: singleton = 0x%p(0x%p)\n"),
                PointerValue(this->singletonInstance), this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr);
            Output::Print(_u("   fixed fields:"));

            for (PropertyIndex i = 0; i < GetPathLength(); i++)
            {
                Output::Print(_u(" %s %d%d%d,"), GetPropertyId(i)->GetBuffer(),
                    i < GetMaxInitializedLength() ? 1 : 0,
                    GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                    GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
            }

            Output::Print(_u("\n"));
        }
#endif

        return propertyIndex;
    }